

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

base_learner * ftrl_setup(options_i *options,vw *all)

{
  float fVar1;
  vw *pvVar2;
  long *plVar3;
  byte bVar4;
  pointer pfVar5;
  ostream *poVar6;
  void *pvVar7;
  unsigned_long uVar8;
  vw *in_RSI;
  long *in_RDI;
  learner<ftrl,_example> *l;
  string algorithm_name;
  _func_void_ftrl_ptr_single_learner_ptr_example_ptr *learn_ptr;
  option_group_definition new_options;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  undefined4 in_stack_fffffffffffff668;
  uint32_t in_stack_fffffffffffff66c;
  typed_option<float> *in_stack_fffffffffffff670;
  string *in_stack_fffffffffffff678;
  free_ptr<ftrl> *in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff688;
  uint32_t in_stack_fffffffffffff68c;
  learner<ftrl,_example> *in_stack_fffffffffffff690;
  string *in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  typed_option<float> *in_stack_fffffffffffff6b8;
  option_group_definition *in_stack_fffffffffffff6c0;
  allocator *paVar9;
  float local_8d4;
  float local_8b8;
  float local_89c;
  float local_880;
  learner<ftrl,_example> *local_7d8;
  allocator local_7c9;
  string local_7c8 [32];
  string local_7a8 [32];
  free_ptr<ftrl> *local_788;
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [32];
  undefined4 local_6e0;
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [359];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  typed_option<bool> local_370 [2];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<bool> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  vw *local_18;
  long *local_10;
  typed_option<float> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<ftrl>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Follow the Regularized Leader",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff670,
             (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"ftrl",&local_201);
  VW::config::make_option<bool>(in_stack_fffffffffffff678,(bool *)in_stack_fffffffffffff670);
  VW::config::typed_option<bool>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"FTRL: Follow the Proximal Regularized Leader",&local_229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff670,
             (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff670,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff6c0,(typed_option<bool> *)in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"pistol",&local_391);
  VW::config::make_option<bool>(in_stack_fffffffffffff678,(bool *)in_stack_fffffffffffff670);
  VW::config::typed_option<bool>::keep(local_370,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"FTRL beta parameter",&local_3b9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff670,
             (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff670,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff6c0,(typed_option<bool> *)in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"ftrl_alpha",&local_521);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
            ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc044);
  VW::config::make_option<float>(in_stack_fffffffffffff678,(float *)in_stack_fffffffffffff670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"Learning rate for FTRL optimization",&local_549);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff670,
             (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff670,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"ftrl_beta",&local_6b1);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
            ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc12a);
  VW::config::make_option<float>(in_stack_fffffffffffff678,(float *)in_stack_fffffffffffff670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"Learning rate for FTRL optimization",&local_6d9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff670,
             (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff670,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff670);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (**(code **)*local_10)(local_10,local_68);
  plVar3 = local_10;
  if (((local_29 & 1) == 0) && ((local_2a & 1) == 0)) {
    local_8 = (typed_option<float> *)0x0;
    local_6e0 = 1;
  }
  else {
    if ((local_29 & 1) == 0) {
      if ((local_2a & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_750,"ftrl_alpha",&local_751);
        bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_750);
        if ((bVar4 & 1) == 0) {
          local_8b8 = 1.0;
        }
        else {
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cca0d);
          local_8b8 = pfVar5->ftrl_alpha;
        }
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cca4f);
        pfVar5->ftrl_alpha = local_8b8;
        std::__cxx11::string::~string(local_750);
        std::allocator<char>::~allocator((allocator<char> *)&local_751);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_778,"ftrl_beta",&local_779);
        bVar4 = (**(code **)(*local_10 + 8))(local_10,local_778);
        if ((bVar4 & 1) == 0) {
          local_8d4 = 0.5;
        }
        else {
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccaf6);
          local_8d4 = pfVar5->ftrl_beta;
        }
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccb38);
        pfVar5->ftrl_beta = local_8d4;
        std::__cxx11::string::~string(local_778);
        std::allocator<char>::~allocator((allocator<char> *)&local_779);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_700,"ftrl_alpha",&local_701);
      bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_700);
      if ((bVar4 & 1) == 0) {
        local_880 = 0.005;
      }
      else {
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc796);
        local_880 = pfVar5->ftrl_alpha;
      }
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc7d8);
      pfVar5->ftrl_alpha = local_880;
      std::__cxx11::string::~string(local_700);
      std::allocator<char>::~allocator((allocator<char> *)&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_728,"ftrl_beta",&local_729);
      bVar4 = (**(code **)(*local_10 + 8))(local_10,local_728);
      if ((bVar4 & 1) == 0) {
        local_89c = 0.1;
      }
      else {
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc87f);
        local_89c = pfVar5->ftrl_beta;
      }
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cc8c1);
      pfVar5->ftrl_beta = local_89c;
      std::__cxx11::string::~string(local_728);
      std::allocator<char>::~allocator((allocator<char> *)&local_729);
    }
    pvVar2 = local_18;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccc16);
    pfVar5->all = pvVar2;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccc2e);
    pfVar5->no_win_counter = 0;
    local_788 = (free_ptr<ftrl> *)0x0;
    std::__cxx11::string::string(local_7a8);
    if ((local_29 & 1) == 0) {
      if ((local_2a & 1) != 0) {
        std::__cxx11::string::operator=(local_7a8,"PiSTOL");
        local_788 = (free_ptr<ftrl> *)learn_pistol;
      }
    }
    else {
      std::__cxx11::string::operator=(local_7a8,"Proximal-FTRL");
      if ((local_18->audit & 1U) == 0) {
        local_788 = (free_ptr<ftrl> *)learn_proximal<false>;
      }
      else {
        local_788 = (free_ptr<ftrl> *)learn_proximal<true>;
      }
    }
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd01);
    fVar1 = pfVar5->ftrl_alpha;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd1c);
    (pfVar5->data).ftrl_alpha = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd37);
    fVar1 = pfVar5->ftrl_beta;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd52);
    (pfVar5->data).ftrl_beta = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd6d);
    fVar1 = pfVar5->all->l1_lambda;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccd8e);
    (pfVar5->data).l1_lambda = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccda9);
    fVar1 = pfVar5->all->l2_lambda;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccdca);
    (pfVar5->data).l2_lambda = fVar1;
    parameters::stride_shift((parameters *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
    if ((local_18->quiet & 1U) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Enabling FTRL based optimization");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"Algorithm used: ");
      poVar6 = std::operator<<(poVar6,local_7a8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_alpha = ");
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2cceb4);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,pfVar5->ftrl_alpha);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_beta = ");
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccf04);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,pfVar5->ftrl_beta);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    }
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      paVar9 = &local_7c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c8,"early_terminate",paVar9);
      VW::config::options_i::get_typed_option<unsigned_long>
                ((options_i *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 in_stack_fffffffffffff698);
      uVar8 = VW::config::typed_option<unsigned_long>::value
                        ((typed_option<unsigned_long> *)in_stack_fffffffffffff670);
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2ccfd1);
      pfVar5->early_stop_thres = uVar8;
      std::__cxx11::string::~string(local_7c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    }
    if (((local_18->audit & 1U) == 0) && ((local_18->hash_inv & 1U) == 0)) {
      in_stack_fffffffffffff680 = local_788;
      in_stack_fffffffffffff68c =
           parameters::stride_shift
                     ((parameters *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      local_7d8 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                            (in_stack_fffffffffffff680,
                             (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff678,
                             (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff670,
                             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    }
    else {
      parameters::stride_shift
                ((parameters *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      in_stack_fffffffffffff690 =
           LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                     (in_stack_fffffffffffff680,
                      (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff678,
                      (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff670,
                      CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      local_7d8 = in_stack_fffffffffffff690;
    }
    LEARNER::learner<ftrl,_example>::set_sensitivity(local_7d8,sensitivity);
    if (((local_18->audit & 1U) == 0) && ((local_18->hash_inv & 1U) == 0)) {
      LEARNER::learner<ftrl,example>::set_multipredict<LEARNER::learner<char,char>>
                ((learner<ftrl,example> *)local_7d8,multipredict<false>);
    }
    else {
      LEARNER::learner<ftrl,example>::set_multipredict<LEARNER::learner<char,char>>
                ((learner<ftrl,example> *)local_7d8,multipredict<true>);
    }
    LEARNER::learner<ftrl,_example>::set_save_load(local_7d8,save_load);
    LEARNER::learner<ftrl,_example>::set_end_pass
              (in_stack_fffffffffffff690,
               (_func_void_ftrl_ptr *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688))
    ;
    in_stack_fffffffffffff670 = (typed_option<float> *)LEARNER::make_base<ftrl,example>(local_7d8);
    local_6e0 = 1;
    local_8 = in_stack_fffffffffffff670;
    std::__cxx11::string::~string(local_7a8);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff670);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::~unique_ptr(in_stack_fffffffffffff680);
  return (base_learner *)local_8;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("pistol", pistol).keep().help("FTRL beta parameter"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }

  b->all = &all;
  b->no_win_counter = 0;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
  }
  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  all.weights.stride_shift(2);  // NOTE: for more parameter storage

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}